

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arithmetic.hpp
# Opt level: O3

void InstructionSet::x86::Primitive::
     sub<false,(InstructionSet::x86::AccessType)0,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
               (access_t<unsigned_short,_(InstructionSet::x86::AccessType)0> destination,
               read_t<unsigned_short> source,Context *context)

{
  uint uVar1;
  uint uVar2;
  undefined6 in_register_00000032;
  uint uVar3;
  undefined6 in_register_0000003a;
  
  uVar2 = (uint)CONCAT62(in_register_00000032,source);
  uVar3 = (uint)CONCAT62(in_register_0000003a,destination);
  uVar1 = uVar3 - uVar2;
  (context->flags).carry_ =
       ((~(uVar1 & 0xffff) | (uVar2 ^ 0xffff) & uVar3) & (uVar2 ^ 0xffff | uVar3)) >> 0xf ^ 1;
  (context->flags).auxiliary_carry_ = (uVar2 ^ uVar3 ^ uVar1) >> 4 & 1;
  (context->flags).overflow_ = (uVar1 ^ uVar3) & (uVar2 ^ uVar3) & 0x8000;
  Flags::
  set_from<unsigned_short,(InstructionSet::x86::Flag)7,(InstructionSet::x86::Flag)2,(InstructionSet::x86::Flag)8>
            (&context->flags,(unsigned_short)uVar1);
  return;
}

Assistant:

void sub(
	access_t<IntT, destination_type> destination,
	read_t<IntT> source,
	ContextT &context
) {
	/*
		DEST ← DEST - (SRC [+ CF]);
	*/
	/*
		The OF, SF, ZF, AF, CF, and PF flags are set according to the result.
	*/
	const IntT result = destination - source - (with_borrow ? context.flags.template carry_bit<IntT>() : 0);

	context.flags.template set_from<Flag::Carry>(
		Numeric::carried_out<false, Numeric::bit_size<IntT>() - 1>(destination, source, result));
	context.flags.template set_from<Flag::AuxiliaryCarry>(
		Numeric::carried_in<4>(destination, source, result));
	context.flags.template set_from<Flag::Overflow>(
		Numeric::overflow<false, IntT>(destination, source, result));

	context.flags.template set_from<IntT, Flag::Zero, Flag::Sign, Flag::ParityOdd>(result);

	if constexpr (is_writeable(destination_type)) {
		destination = result;
	}
}